

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
yy::parser::yy_print_<yy::parser::by_state>
          (parser *this,ostream *yyo,basic_symbol<yy::parser::by_state> *yysym)

{
  char cVar1;
  long lVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  char *pcVar5;
  string local_40;
  
  cVar1 = (yysym->super_by_state).state;
  lVar2 = (long)cVar1;
  if ((lVar2 != 0) && (yystos_[lVar2] != -2)) {
    if (cVar1 == '\0') {
      pcVar5 = "token";
    }
    else {
      pcVar5 = "nterm";
      if ((char)yystos_[lVar2] < '\x13') {
        pcVar5 = "token";
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(yyo,pcVar5,5);
    local_40._M_dataplus._M_p._0_1_ = 0x20;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(yyo,(char *)&local_40,1);
    basic_symbol<yy::parser::by_state>::name_abi_cxx11_(&local_40,yysym);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                                local_40._M_dataplus._M_p._0_1_),
                        local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    pbVar4 = operator<<(poVar3,&yysym->location);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar4,": ",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_),
                      local_40.field_2._M_allocated_capacity + 1);
    }
    local_40._M_dataplus._M_p._0_1_ = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>(yyo,(char *)&local_40,1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(yyo,"empty symbol",0xc);
  return;
}

Assistant:

void
  parser::yy_print_ (std::ostream& yyo, const basic_symbol<Base>& yysym) const
  {
    std::ostream& yyoutput = yyo;
    YY_USE (yyoutput);
    if (yysym.empty ())
      yyo << "empty symbol";
    else
      {
        symbol_kind_type yykind = yysym.kind ();
        yyo << (yykind < YYNTOKENS ? "token" : "nterm")
            << ' ' << yysym.name () << " ("
            << yysym.location << ": ";
        YY_USE (yykind);
        yyo << ')';
      }
  }